

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_mon_spell_power_cutoff(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  monster_spell_level *pmVar3;
  monster_spell_level *new;
  monster_spell_level *l;
  monster_spell *s;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pmVar3 = (monster_spell_level *)mem_zalloc(0x40);
    wVar1 = parser_getint(p,"power");
    pmVar3->power = wVar1;
    for (new = *(monster_spell_level **)((long)pvVar2 + 0x20);
        new->next != (monster_spell_level *)0x0; new = new->next) {
    }
    new->next = pmVar3;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_mon_spell_power_cutoff(struct parser *p) {
	struct monster_spell *s = parser_priv(p);
	struct monster_spell_level *l, *new;

	if (!s) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	new = mem_zalloc(sizeof(*new));
	new->power = parser_getint(p, "power");
	l = s->level;
	while (l->next) {
		l = l->next;
	}
	l->next = new;
	return PARSE_ERROR_NONE;
}